

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

int deqp::gles31::Functional::anon_unknown_1::referencePrimitiveCount
              (TessPrimitiveType primitiveType,SpacingMode spacingMode,bool usePointMode,
              float *innerLevels,float *outerLevels)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  undefined7 in_register_00000011;
  uint uVar9;
  void *pvVar10;
  ulong uVar11;
  float fVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int outer_2 [3];
  int iStack_4c;
  pointer local_48;
  int outer [3];
  int local_2c;
  int inner;
  int local_24;
  
  if ((int)CONCAT71(in_register_00000011,usePointMode) == 0) {
    if (TESSPRIMITIVETYPE_ISOLINES < primitiveType) {
      return -1;
    }
    fVar12 = *outerLevels;
    if (0.0 < fVar12) {
      uVar11 = 0;
      do {
        if (*(ulong *)(&DAT_01c39e18 + (ulong)primitiveType * 8) - 1 == uVar11) goto LAB_0140f092;
        uVar1 = uVar11 + 1;
        lVar4 = uVar11 + 1;
        uVar11 = uVar1;
      } while (0.0 < outerLevels[lVar4]);
      if (*(ulong *)(&DAT_01c39e18 + (ulong)primitiveType * 8) <= uVar1) {
LAB_0140f092:
        if (primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
          fVar2 = outerLevels[1];
          fVar3 = 1.0;
          if (1.0 <= fVar12) {
            fVar3 = fVar12;
          }
          fVar12 = ceilf(fVar3);
          iVar6 = getClampedRoundedTessLevel(spacingMode,fVar2);
          return iVar6 * (int)fVar12;
        }
        if (primitiveType != TESSPRIMITIVETYPE_QUADS) {
          if (primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
            return -1;
          }
          getClampedRoundedTriangleTessLevels
                    (spacingMode,outerLevels,(float *)outer,outer_2,(int *)outerLevels);
          if (outer[0] == 1) {
            if (outer_2[2] == 1 && (outer_2[1] == 1 && outer_2[0] == 1)) {
              return 1;
            }
            outer[0] = spacingMode == SPACINGMODE_FRACTIONAL_ODD | 2;
            uVar7 = outer_2[1] + outer_2[0] + outer_2[2];
            uVar9 = 1;
          }
          else {
            uVar7 = outer_2[1] + outer_2[0] + outer_2[2];
            if (outer[0] < 2) {
              return uVar7;
            }
            uVar9 = (uint)outer[0] >> 1;
          }
          uVar8 = uVar9 + 3 & 0xfffffffc;
          uVar9 = uVar9 - 1;
          uVar20 = 0;
          uVar21 = 1;
          uVar22 = 2;
          uVar5 = 3;
          uVar15 = 0;
          uVar17 = 0;
          uVar19 = 0;
          do {
            uVar18 = uVar19;
            uVar16 = uVar17;
            uVar14 = uVar15;
            uVar13 = uVar7;
            uVar26 = uVar5;
            uVar25 = uVar22;
            uVar24 = uVar21;
            uVar23 = uVar20;
            auVar27._0_4_ = outer[0] + uVar23 * -2 + -2;
            auVar27._4_4_ = outer[0] + uVar24 * -2 + -2;
            auVar27._8_4_ = outer[0] + uVar25 * -2 + -2;
            auVar27._12_4_ = outer[0] + uVar26 * -2 + -2;
            auVar28._4_4_ = auVar27._4_4_;
            auVar28._0_4_ = auVar27._4_4_;
            auVar28._8_4_ = auVar27._12_4_;
            auVar28._12_4_ = auVar27._12_4_;
            uVar7 = (-(uint)(auVar27._0_4_ == 1) & 4 |
                    ~-(uint)(auVar27._0_4_ == 1) & auVar27._0_4_ * 6) + uVar13;
            uVar15 = (-(uint)(auVar27._4_4_ == 1) & 4 |
                     ~-(uint)(auVar27._4_4_ == 1) & auVar27._4_4_ * 6) + uVar14;
            uVar17 = (-(uint)(auVar27._8_4_ == 1) & 4 |
                     ~-(uint)(auVar27._8_4_ == 1) & (uint)((auVar27._8_8_ & 0xffffffff) * 6)) +
                     uVar16;
            uVar19 = (-(uint)(auVar27._12_4_ == 1) & 4 |
                     ~-(uint)(auVar27._12_4_ == 1) & (uint)((auVar28._8_8_ & 0xffffffff) * 6)) +
                     uVar18;
            uVar8 = uVar8 - 4;
            uVar20 = uVar23 + 4;
            uVar21 = uVar24 + 4;
            uVar22 = uVar25 + 4;
            uVar5 = uVar26 + 4;
          } while (uVar8 != 0);
          uVar20 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)(uVar23 ^ 0x80000000));
          uVar21 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)(uVar24 ^ 0x80000000));
          uVar22 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)(uVar25 ^ 0x80000000));
          uVar9 = -(uint)((int)(uVar9 ^ 0x80000000) < (int)(uVar26 ^ 0x80000000));
          return (~uVar9 & uVar19 | uVar18 & uVar9) + (~uVar21 & uVar15 | uVar14 & uVar21) +
                 (~uVar22 & uVar17 | uVar16 & uVar22) + (~uVar20 & uVar7 | uVar13 & uVar20);
        }
        getClampedRoundedQuadTessLevels(spacingMode,innerLevels,outerLevels,outer,outer_2);
        if (outer[0] == 1 || outer[1] == 1) {
          if ((((outer[0] == 1) && (outer[1] == 1)) && (outer_2[0] == 1)) &&
             (((outer_2[1] == 1 && (outer_2[2] == 1)) && (iStack_4c == 1)))) {
            return 2;
          }
          uVar7 = spacingMode == SPACINGMODE_FRACTIONAL_ODD | 2;
          if (outer[0] < 2) {
            outer[0] = uVar7;
          }
          if (outer[1] < 2) {
            outer[1] = uVar7;
          }
        }
        return outer_2[2] + iStack_4c + outer_2[0] + outer_2[1] + outer[1] * 2 +
               (outer[1] - 1U) * (outer[0] * 2 + -4) + -4;
      }
    }
  }
  else {
    if (TESSPRIMITIVETYPE_ISOLINES < primitiveType) {
      return -1;
    }
    fVar12 = *outerLevels;
    if (0.0 < fVar12) {
      uVar11 = 0;
      do {
        if (*(ulong *)(&DAT_01c39e18 + (ulong)primitiveType * 8) - 1 == uVar11) goto LAB_0140efec;
        uVar1 = uVar11 + 1;
        lVar4 = uVar11 + 1;
        uVar11 = uVar1;
      } while (0.0 < outerLevels[lVar4]);
      if (*(ulong *)(&DAT_01c39e18 + (ulong)primitiveType * 8) <= uVar1) {
LAB_0140efec:
        if (primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
          fVar2 = outerLevels[1];
          fVar3 = 1.0;
          if (1.0 <= fVar12) {
            fVar3 = fVar12;
          }
          fVar12 = ceilf(fVar3);
          iVar6 = getClampedRoundedTessLevel(spacingMode,fVar2);
          generateReferenceIsolineTessCoords
                    ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                     outer_2,(int)fVar12,iVar6);
          pvVar10 = (void *)CONCAT44(outer_2[1],outer_2[0]);
        }
        else {
          if (primitiveType == TESSPRIMITIVETYPE_QUADS) {
            getClampedRoundedQuadTessLevels(spacingMode,innerLevels,outerLevels,&inner,outer);
            generateReferenceQuadTessCoords
                      ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                       outer_2,spacingMode,inner,local_24,outer[0],outer[1],outer[2],local_2c);
          }
          else {
            if (primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
              return -1;
            }
            getClampedRoundedTriangleTessLevels
                      (spacingMode,outerLevels,(float *)&inner,outer,(int *)outerLevels);
            generateReferenceTriangleTessCoords
                      ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                       outer_2,spacingMode,inner,outer[0],outer[1],outer[2]);
          }
          pvVar10 = (void *)CONCAT44(outer_2[1],outer_2[0]);
        }
        if (pvVar10 != (void *)0x0) {
          operator_delete(pvVar10,(long)local_48 - (long)pvVar10);
        }
        return (int)((ulong)(CONCAT44(iStack_4c,outer_2[2]) - (long)pvVar10) >> 2) * -0x55555555;
      }
    }
  }
  return 0;
}

Assistant:

static int referencePrimitiveCount (TessPrimitiveType primitiveType, SpacingMode spacingMode, bool usePointMode, const float* innerLevels, const float* outerLevels)
{
	return usePointMode ? referencePointModePrimitiveCount		(primitiveType, spacingMode, innerLevels, outerLevels)
						: referenceNonPointModePrimitiveCount	(primitiveType, spacingMode, innerLevels, outerLevels);
}